

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_red_cross_parcel(tgestate_t *state)

{
  tgestate_t *in_RDI;
  item_t *item;
  item_t *local_10;
  
  in_RDI->item_structs[0xc].room_and_flags = '?';
  local_10 = in_RDI->items_held;
  if (*local_10 != '\f') {
    local_10 = in_RDI->items_held + 1;
  }
  *local_10 = 0xff;
  draw_all_items((tgestate_t *)0x1086a2);
  drop_item_tail(state,item._7_1_);
  queue_message(in_RDI,message_YOU_OPEN_THE_BOX);
  increase_morale_by_10_score_by_50((tgestate_t *)0x1086d1);
  return;
}

Assistant:

void action_red_cross_parcel(tgestate_t *state)
{
  item_t *item; /* was HL */

  assert(state != NULL);

  state->item_structs[item_RED_CROSS_PARCEL].room_and_flags = room_NONE & itemstruct_ROOM_MASK;

  item = &state->items_held[0];
  if (*item != item_RED_CROSS_PARCEL)
    item++; /* One or the other must be a red cross parcel item, so advance. */
  *item = item_NONE; /* Parcel opened. */

  draw_all_items(state);

  drop_item_tail(state, state->red_cross_parcel_current_contents);

  queue_message(state, message_YOU_OPEN_THE_BOX);
  increase_morale_by_10_score_by_50(state);
}